

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O0

string * choc::text::addDoubleQuotes(string *__return_storage_ptr__,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *text_local;
  
  local_18 = text;
  text_local = __return_storage_ptr__;
  std::operator+(&local_38,"\"",text);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string addDoubleQuotes (std::string text)          { return "\"" + std::move (text) + "\""; }